

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void asmjit::BaseBuilder_deletePasses(BaseBuilder *self)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  
  pvVar2 = (self->_passes).super_ZoneVectorBase._data;
  uVar1 = (self->_passes).super_ZoneVectorBase._size;
  for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    (**(code **)**(undefined8 **)((long)pvVar2 + lVar3))();
  }
  (self->_passes).super_ZoneVectorBase._data = (void *)0x0;
  (self->_passes).super_ZoneVectorBase._size = 0;
  (self->_passes).super_ZoneVectorBase._capacity = 0;
  return;
}

Assistant:

static void BaseBuilder_deletePasses(BaseBuilder* self) noexcept {
  for (Pass* pass : self->_passes)
    pass->~Pass();
  self->_passes.reset();
}